

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O1

int64_t __thiscall aeron::DriverProxy::removeCounter(DriverProxy *this,int64_t registrationId)

{
  long *plVar1;
  int64_t correlationId;
  long local_30;
  int64_t local_28;
  anon_class_24_3_80c13eea local_20;
  
  local_20.registrationId = &local_28;
  LOCK();
  plVar1 = (long *)(this->m_toDriverCommandBuffer->m_buffer->m_buffer +
                   this->m_toDriverCommandBuffer->m_correlationIdCounterIndex);
  local_30 = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  local_20.correlationId = &local_30;
  local_28 = registrationId;
  local_20.this = this;
  writeCommandToDriver<aeron::DriverProxy::removeCounter(long)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (this,&local_20);
  return local_30;
}

Assistant:

std::int64_t removeCounter(std::int64_t registrationId)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            RemoveMessageFlyweight command(buffer, 0);

            command.clientId(m_clientId);
            command.correlationId(correlationId);
            command.registrationId(registrationId);

            length = command.length();

            return ControlProtocolEvents::REMOVE_COUNTER;
        });

        return correlationId;
    }